

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall StateScene::draw(StateScene *this)

{
  int iVar1;
  pointer pPVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  string *str;
  long lVar11;
  int iVar12;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  stringstream stateString;
  ostream local_950 [376];
  stringstream countString;
  ostream local_7c8 [376];
  stringstream sunNumberString;
  ostream local_640 [376];
  stringstream levelString;
  ostream local_4b8 [376];
  stringstream scoreString;
  ostream local_330 [376];
  stringstream sunsString;
  ostream local_1a8 [376];
  
  drawRect(this->x,this->y,this->w,this->h,0x19);
  std::__cxx11::stringstream::stringstream((stringstream *)&stateString);
  switch(this->state) {
  case 0:
    std::operator<<(local_950,"NORMAL");
    iVar12 = this->x;
    iVar3 = this->y;
    str = &local_980;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar3 + 1,str,0,0xf);
    break;
  case 1:
    std::operator<<(local_950,"PLANT");
    iVar12 = this->x;
    iVar3 = this->y;
    str = &local_9c0;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar3 + 1,str,0x22,0xf);
    break;
  case 2:
    std::operator<<(local_950,"REMOVE");
    iVar12 = this->x;
    iVar3 = this->y;
    str = &local_9e0;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar3 + 1,str,9,0xf);
    break;
  default:
    goto switchD_0010bef6_caseD_3;
  case 4:
    std::operator<<(local_950,"PAUSE");
    iVar12 = this->x;
    iVar3 = this->y;
    str = &local_9a0;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar3 + 1,str,0xb2,0xf);
    break;
  case 5:
    std::operator<<(local_950,"GAME OVER");
    iVar12 = this->x;
    iVar3 = this->y;
    str = &local_a00;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar3 + 1,str,0x37,0xf);
  }
  std::__cxx11::string::~string((string *)str);
switchD_0010bef6_caseD_3:
  std::__cxx11::stringstream::stringstream((stringstream *)&sunsString);
  poVar5 = std::operator<<(local_1a8,"SUN: ");
  std::ostream::operator<<(poVar5,this->sunsNumber);
  iVar12 = this->x;
  iVar3 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar3 + 2,&local_a80,0xd0,0xf);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::stringstream::stringstream((stringstream *)&scoreString);
  poVar5 = std::operator<<(local_330,"SCORE: ");
  std::ostream::operator<<(poVar5,this->score);
  iVar12 = this->x;
  iVar3 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar3 + 3,&local_aa0,0x19,0xf);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::stringstream::stringstream((stringstream *)&levelString);
  poVar5 = std::operator<<(local_4b8,"LEVEL: ");
  std::ostream::operator<<(poVar5,this->level);
  iVar12 = this->x;
  iVar3 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar3 + 4,&local_ac0,0,0xf);
  std::__cxx11::string::~string((string *)&local_ac0);
  drawLine(this->x + 1,this->y + 1,this->h + -2,false,0xb);
  drawLine(this->stateW + this->x,this->y + 1,this->h + -2,false,0xb);
  iVar12 = this->startIndex;
  lVar8 = (long)iVar12;
  iVar3 = iVar12 * 7 + 2;
  lVar6 = lVar8 * 0x38;
  lVar11 = 0;
  lVar9 = lVar8;
  while( true ) {
    pPVar2 = (this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = this->plantsNumber + iVar12;
    iVar4 = (int)(((long)(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x38);
    if (iVar4 <= iVar7) {
      iVar7 = iVar4;
    }
    iVar4 = this->x;
    if (iVar7 <= lVar9) break;
    iVar7 = this->y;
    iVar1 = this->stateW;
    std::__cxx11::string::string
              ((string *)&local_a20,(string *)((long)&(pPVar2->name)._M_dataplus._M_p + lVar6));
    iVar10 = (int)lVar11;
    drawText(iVar1 + iVar4 + iVar12 * -7 + iVar3 + iVar10,iVar7 + 3,&local_a20,0xf,
             (&(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8].color)[lVar11 * 2]);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::stringstream::stringstream((stringstream *)&sunNumberString);
    std::ostream::operator<<
              (local_640,
               (&(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].needSunNumber)[lVar11 * 2]);
    iVar12 = this->x;
    iVar7 = this->y;
    iVar4 = this->stateW;
    iVar1 = this->startIndex;
    std::__cxx11::stringbuf::str();
    drawText(iVar4 + iVar12 + iVar1 * -7 + iVar3 + iVar10,iVar7 + 4,&local_a40,0xf,0xd0);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::stringstream::stringstream((stringstream *)&countString);
    std::ostream::operator<<
              (local_7c8,
               (&(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].count)[lVar11 * 2]);
    iVar12 = this->x;
    iVar7 = this->y;
    iVar4 = this->stateW;
    iVar1 = this->startIndex;
    std::__cxx11::stringbuf::str();
    drawText(iVar4 + iVar12 + iVar1 * -7 + iVar3 + iVar10,iVar7 + 5,&local_a60,0xf,0x1b);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::stringstream::~stringstream((stringstream *)&countString);
    std::__cxx11::stringstream::~stringstream((stringstream *)&sunNumberString);
    lVar9 = lVar9 + 1;
    iVar12 = this->startIndex;
    lVar11 = lVar11 + 7;
    lVar6 = lVar6 + 0x38;
  }
  drawRect(this->selectIndex * 7 + iVar4 + this->stateW + 1,this->y + 1,7,7,9);
  std::__cxx11::stringstream::~stringstream((stringstream *)&levelString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&scoreString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sunsString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stateString);
  return;
}

Assistant:

void StateScene::draw(){
	drawRect(x, y, w, h, BLUE);
	std::stringstream stateString;
	switch(state){
		case STATE_NORMAL:
			stateString << "NORMAL";
			drawText(x+2, y+1, stateString.str(), BLACK, WHITE);
			break;
		case STATE_PAUSE:
			stateString << "PAUSE";
			drawText(x+2, y+1, stateString.str(), YELLOW, WHITE);
			break;
		case STATE_PLANT:
			stateString << "PLANT";
			drawText(x+2, y+1, stateString.str(), GREEN, WHITE);
			break;
		case STATE_REMOVE:
			stateString << "REMOVE";
			drawText(x+2, y+1, stateString.str(), RED, WHITE);
			break;
		case STATE_OVER:
			stateString << "GAME OVER";
			drawText(x+2, y+1, stateString.str(), PURPLE, WHITE);
			break;

	}
	std::stringstream sunsString;
	sunsString << "SUN: " << sunsNumber;
	drawText(x+2, y+2, sunsString.str(), ORANGE, WHITE);
	std::stringstream scoreString;
	scoreString << "SCORE: " << score;
	drawText(x+2, y+3, scoreString.str(), BLUE, WHITE);
	std::stringstream levelString;
	levelString << "LEVEL: " << level;
	drawText(x+2, y+4, levelString.str(), BLACK, WHITE);



	drawLine(x+1, y+1, h-2, 0, LIGHTYELLOW);	
	drawLine(x+1+stateW-1, y+1, h-2, 0, LIGHTYELLOW);	

	
	for(int i = startIndex; i < std::min((int)infos.size(), startIndex+plantsNumber); ++i){
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+3, infos[i].name, WHITE, infos[i].color);
		std::stringstream sunNumberString;
		sunNumberString << infos[i].needSunNumber;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+4, sunNumberString.str(), WHITE, ORANGE);
		std::stringstream countString;
		countString << infos[i].count;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+5, countString.str(), WHITE, LIGHTBLUE);
	}


	drawRect(x+1+stateW+selectIndex*BLOCKW, y+1, BLOCKW, BLOCKW, RED);
}